

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall reduceDB_tch::operator()(reduceDB_tch *this,CRef x,CRef y)

{
  ulong *puVar1;
  ulong *puVar2;
  uint *puVar3;
  
  puVar3 = (this->ca->super_RegionAllocator<unsigned_int>).memory;
  puVar1 = (ulong *)(puVar3 + x);
  puVar2 = (ulong *)(puVar3 + y);
  return *(uint *)((long)puVar1 + (*puVar1 >> 0x22) * 4 + 0xc) <
         *(uint *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 0xc);
}

Assistant:

bool operator()(CRef x, CRef y) const { return ca[x].touched() < ca[y].touched(); }